

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.h
# Opt level: O3

bool QMetaType::
     registerMutableView<QList<QPersistentModelIndex>,QIterable<QMetaSequence>,QtPrivate::QSequentialIterableMutableViewFunctor<QList<QPersistentModelIndex>>>
               (void)

{
  long lVar1;
  MutableViewFunction view;
  bool bVar2;
  long in_FS_OFFSET;
  code *pcVar3;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar3 = std::
           _Function_handler<bool_(void_*,_void_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/corelib/kernel/qmetatype.h:661:21)>
           ::_M_manager;
  view.super__Function_base._M_manager =
       std::
       _Function_handler<bool_(void_*,_void_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/corelib/kernel/qmetatype.h:661:21)>
       ::_M_manager;
  view.super__Function_base._M_functor = (_Any_data)ZEXT816(0xaa);
  view._M_invoker =
       std::
       _Function_handler<bool_(void_*,_void_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/corelib/kernel/qmetatype.h:661:21)>
       ::_M_invoke;
  bVar2 = registerMutableViewImpl<QList<QPersistentModelIndex>,QIterable<QMetaSequence>>
                    (view,(QMetaTypeInterface *)&stack0xffffffffffffffc8,(QMetaType)0x6b0080);
  if (pcVar3 != (code *)0x0) {
    (*pcVar3)(&stack0xffffffffffffffc8,&stack0xffffffffffffffc8,3);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

static bool registerMutableView(UnaryFunction function)
    {
        static_assert((!QMetaTypeId2<To>::IsBuiltIn || !QMetaTypeId2<From>::IsBuiltIn),
            "QMetaType::registerMutableView: At least one of the types must be a custom type.");

        const QMetaType fromType = QMetaType::fromType<From>();
        const QMetaType toType = QMetaType::fromType<To>();
        auto view = [function = std::move(function)](void *from, void *to) -> bool {
            From *f = static_cast<From *>(from);
            To *t = static_cast<To *>(to);
            *t = function(*f);
            return true;
        };
        return registerMutableViewImpl<From, To>(std::move(view), fromType, toType);
    }